

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trsm.hpp
# Opt level: O3

void remora::bindings::
     trsm_block<32ul,16ul,false,remora::dense_matrix_adaptor<double_const,remora::row_major,remora::dense_tag,remora::cpu_tag>,remora::dense_matrix_adaptor<double,remora::column_major,remora::dense_tag,remora::cpu_tag>>
               (undefined8 *A,long *B)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  invalid_argument *this;
  long lVar5;
  long lVar6;
  double *pdVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  void *__src;
  size_t __n;
  double dVar11;
  value_type blockA [32] [32];
  double local_2038 [1025];
  
  lVar1 = A[1];
  if (lVar1 != 0) {
    __src = (void *)*A;
    lVar2 = A[3];
    __n = 8;
    pdVar7 = local_2038;
    lVar5 = lVar1;
    do {
      memcpy(pdVar7,__src,__n);
      __n = __n + 8;
      __src = (void *)((long)__src + lVar2 * 8);
      pdVar7 = pdVar7 + 0x20;
      lVar5 = lVar5 + -1;
    } while (lVar5 != 0);
  }
  lVar2 = B[2];
  if (lVar2 != 0) {
    lVar5 = 0;
    lVar6 = 0;
    do {
      if (lVar1 != 0) {
        lVar8 = 0;
        pdVar7 = local_2038;
        do {
          if (lVar8 != 0) {
            lVar3 = *B;
            lVar4 = B[3];
            lVar9 = lVar3 + lVar4 * lVar6 * 8;
            dVar11 = *(double *)(lVar9 + lVar8 * 8);
            lVar10 = 0;
            do {
              dVar11 = dVar11 - pdVar7[lVar10] * *(double *)(lVar4 * lVar5 + lVar3 + lVar10 * 8);
              *(double *)(lVar9 + lVar8 * 8) = dVar11;
              lVar10 = lVar10 + 1;
            } while (lVar8 != lVar10);
          }
          dVar11 = local_2038[lVar8 * 0x21];
          if ((dVar11 == 0.0) && (!NAN(dVar11))) {
            this = (invalid_argument *)__cxa_allocate_exception(0x10);
            std::invalid_argument::invalid_argument(this,"[TRSM] Matrix is singular!");
            __cxa_throw(this,&std::invalid_argument::typeinfo,
                        std::invalid_argument::~invalid_argument);
          }
          lVar9 = B[3] * lVar6 * 8 + *B;
          *(double *)(lVar9 + lVar8 * 8) = *(double *)(lVar9 + lVar8 * 8) / dVar11;
          lVar8 = lVar8 + 1;
          pdVar7 = pdVar7 + 0x20;
        } while (lVar8 != lVar1);
      }
      lVar6 = lVar6 + 1;
      lVar5 = lVar5 + 8;
    } while (lVar6 != lVar2);
  }
  return;
}

Assistant:

void trsm_block(
	matrix_expression<MatA, cpu_tag> const& A,
	matrix_expression<MatB, cpu_tag>& B,
	lower,
	column_major // B is column-major
) {
	typedef typename MatA::value_type value_type;
	auto A_elem = A().elements();
	//evaluate and copy block of A
	std::size_t size = A().size1();
	value_type blockA[maxBlockSize1][maxBlockSize1];
	for(std::size_t i = 0; i != size; ++i){
		for(std::size_t j = 0; j <= i; ++j){
			blockA[i][j] = A_elem(i,j);
		}
	}

	//compute trsv kernel for each column in B
	for(std::size_t k = 0; k != B().size2(); ++k){
		for (std::size_t i = 0; i != size; ++i) {
			for (std::size_t j = 0; j != i; ++j) {
				B()(i,k) -= blockA[i][j] * B()(j,k);
			}
			if(!Unit){
				if(blockA[i][i] == value_type())
					throw std::invalid_argument("[TRSM] Matrix is singular!");
				B()(i,k) /= blockA[i][i];
			}
		}
	}
}